

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JtagAnalyzer.cpp
# Opt level: O1

void __thiscall JtagAnalyzer::SetupResults(JtagAnalyzer *this)

{
  JtagAnalyzerResults *pJVar1;
  char cVar2;
  JtagAnalyzerResults *this_00;
  Channel local_30 [16];
  
  this_00 = (JtagAnalyzerResults *)operator_new(0x50);
  JtagAnalyzerResults::JtagAnalyzerResults(this_00,this,&this->mSettings);
  pJVar1 = (this->mResults)._M_ptr;
  if (pJVar1 != this_00) {
    if (pJVar1 != (JtagAnalyzerResults *)0x0) {
      (**(code **)(*(long *)pJVar1 + 8))();
    }
    (this->mResults)._M_ptr = this_00;
  }
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)(this->mResults)._M_ptr);
  Channel::Channel(local_30,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  cVar2 = Channel::operator!=(&(this->mSettings).mTdiChannel,local_30);
  Channel::~Channel(local_30);
  if (cVar2 != '\0') {
    AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)(this->mResults)._M_ptr);
  }
  Channel::Channel(local_30,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  cVar2 = Channel::operator!=(&(this->mSettings).mTdoChannel,local_30);
  Channel::~Channel(local_30);
  if (cVar2 != '\0') {
    AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)(this->mResults)._M_ptr);
  }
  return;
}

Assistant:

void JtagAnalyzer::SetupResults()
{
    mResults.reset( new JtagAnalyzerResults( this, &mSettings ) );
    SetAnalyzerResults( mResults.get() );

    // set which channels will carry bubbles
    mResults->AddChannelBubblesWillAppearOn( mSettings.mTmsChannel );
    if( mSettings.mTdiChannel != UNDEFINED_CHANNEL )
        mResults->AddChannelBubblesWillAppearOn( mSettings.mTdiChannel );
    if( mSettings.mTdoChannel != UNDEFINED_CHANNEL )
        mResults->AddChannelBubblesWillAppearOn( mSettings.mTdoChannel );
}